

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O3

void __thiscall Txid_IsValid_Test::~Txid_IsValid_Test(Txid_IsValid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Txid, IsValid) {
  ByteData256 bytes(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  Txid txid(bytes);
  EXPECT_TRUE(txid.IsValid());

  Txid empty_txid;
  EXPECT_FALSE(empty_txid.IsValid());
}